

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::ConditionalCase::setupProgram(ConditionalCase *this,deUint32 program)

{
  code *pcVar1;
  int iVar2;
  undefined4 uVar3;
  deUint32 err;
  undefined4 extraout_var;
  size_type sVar5;
  reference pvVar6;
  undefined4 local_3c;
  int compareAttribLocation;
  int numComponents;
  int location;
  Functions *gl;
  deUint32 program_local;
  ConditionalCase *this_local;
  long lVar4;
  
  iVar2 = (*((this->super_ControlStatementCase).super_ShaderPerformanceCase.m_renderCtx)->
            _vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  if (this->m_decisionType == DECISION_UNIFORM) {
    uVar3 = (**(code **)(lVar4 + 0xb48))(program,"u_compareValue");
    local_3c = 0x3f800000;
    if (this->m_branchType != BRANCH_TRUE) {
      local_3c = 0xbf800000;
    }
    (**(code **)(lVar4 + 0x14e0))(local_3c,uVar3);
  }
  else if (((this->m_decisionType == DECISION_ATTRIBUTE) && (this->m_branchType == BRANCH_MIXED)) &&
          ((this->super_ControlStatementCase).super_ShaderPerformanceCase.m_caseType ==
           CASETYPE_VERTEX)) {
    uVar3 = (**(code **)(lVar4 + 0x780))(program,"a_compareValue");
    (**(code **)(lVar4 + 0x6c8))(1,&this->m_arrayBuffer);
    (**(code **)(lVar4 + 0x40))(0x8892,this->m_arrayBuffer);
    pcVar1 = *(code **)(lVar4 + 0x150);
    sVar5 = std::vector<float,_std::allocator<float>_>::size(&this->m_comparisonValueArray);
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_comparisonValueArray,0)
    ;
    (*pcVar1)(0x8892,sVar5 << 2,pvVar6,0x88e4);
    (**(code **)(lVar4 + 0x610))(uVar3);
    (**(code **)(lVar4 + 0x19f0))(uVar3,4,0x1406,0,0,0);
  }
  err = (**(code **)(lVar4 + 0x800))();
  glu::checkError(err,"Setup program state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderControlStatementTests.cpp"
                  ,0x177);
  return;
}

Assistant:

void ConditionalCase::setupProgram (deUint32 program)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	if (m_decisionType == DECISION_UNIFORM)
	{
		int location = gl.getUniformLocation(program, "u_compareValue");
		gl.uniform1f(location, m_branchType == BRANCH_TRUE ? +1.0f : -1.0f);
	}
	else if (m_decisionType == DECISION_ATTRIBUTE && m_branchType == BRANCH_MIXED && m_caseType == CASETYPE_VERTEX)
	{
		// Setup per-vertex comparison values calculated in init().

		const int	numComponents			= 4;
		int			compareAttribLocation	= gl.getAttribLocation(program, "a_compareValue");

		DE_ASSERT((int)m_comparisonValueArray.size() == numComponents * (getGridWidth() + 1) * (getGridHeight() + 1));

		gl.genBuffers(1, &m_arrayBuffer);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_arrayBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(m_comparisonValueArray.size()*sizeof(float)), &m_comparisonValueArray[0], GL_STATIC_DRAW);
		gl.enableVertexAttribArray(compareAttribLocation);
		gl.vertexAttribPointer(compareAttribLocation, (GLint)numComponents, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Setup program state");
}